

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O2

void ucnv_extContinueMatchFromU_63
               (UConverter *cnv,UConverterFromUnicodeArgs *pArgs,int32_t srcIndex,
               UErrorCode *pErrorCode)

{
  UChar *pre;
  UChar UVar1;
  UChar32 firstCP;
  int32_t iVar2;
  uint uVar3;
  long lVar4;
  undefined4 in_register_00000014;
  char cVar5;
  int preLength;
  int32_t *cx;
  UChar *s;
  UChar *src;
  uint32_t value;
  undefined8 local_40;
  int32_t *local_38;
  
  local_40 = CONCAT44(in_register_00000014,srcIndex);
  value = 0;
  local_38 = (cnv->sharedData->mbcs).extIndexes;
  firstCP = cnv->preFromUFirstCP;
  pre = cnv->preFromU;
  cVar5 = cnv->preFromULength;
  preLength = (int)cVar5;
  src = pArgs->source;
  iVar2 = ucnv_extMatchFromU(local_38,firstCP,pre,preLength,src,
                             (int32_t)((ulong)((long)pArgs->sourceLimit - (long)src) >> 1),&value,
                             cnv->useFallback,pArgs->flush);
  if (iVar2 < 2) {
    if (iVar2 < 0) {
      for (lVar4 = (long)preLength; lVar4 < -2 - iVar2; lVar4 = lVar4 + 1) {
        UVar1 = *src;
        src = src + 1;
        pre[lVar4] = UVar1;
      }
      pArgs->source = src;
      cnv->preFromULength = (int8_t)(-2 - iVar2);
    }
    else {
      if (iVar2 == 1) {
        cnv->useSubChar1 = '\x01';
      }
      cnv->fromUChar32 = firstCP;
      cnv->preFromUFirstCP = -1;
      cnv->preFromULength = -cVar5;
      *pErrorCode = U_INVALID_CHAR_FOUND;
    }
  }
  else {
    uVar3 = iVar2 - 2;
    if ((int)uVar3 < preLength) {
      u_memmove_63(pre,pre + uVar3,preLength - uVar3);
      cVar5 = -(char)(preLength - uVar3);
      cx = (cnv->sharedData->mbcs).extIndexes;
    }
    else {
      pArgs->source = src + (int)(uVar3 - preLength);
      cVar5 = '\0';
      cx = local_38;
    }
    cnv->preFromULength = cVar5;
    cnv->preFromUFirstCP = -1;
    ucnv_extWriteFromU(cnv,cx,value,&pArgs->target,pArgs->targetLimit,&pArgs->offsets,
                       (int32_t)local_40,pErrorCode);
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_extContinueMatchFromU(UConverter *cnv,
                           UConverterFromUnicodeArgs *pArgs, int32_t srcIndex,
                           UErrorCode *pErrorCode) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match;

    match=ucnv_extMatchFromU(cnv->sharedData->mbcs.extIndexes,
                             cnv->preFromUFirstCP,
                             cnv->preFromU, cnv->preFromULength,
                             pArgs->source, (int32_t)(pArgs->sourceLimit-pArgs->source),
                             &value,
                             cnv->useFallback, pArgs->flush);
    if(match>=2) {
        match-=2; /* remove 2 for the initial code point */

        if(match>=cnv->preFromULength) {
            /* advance src pointer for the consumed input */
            pArgs->source+=match-cnv->preFromULength;
            cnv->preFromULength=0;
        } else {
            /* the match did not use all of preFromU[] - keep the rest for replay */
            int32_t length=cnv->preFromULength-match;
            u_memmove(cnv->preFromU, cnv->preFromU+match, length);
            cnv->preFromULength=(int8_t)-length;
        }

        /* finish the partial match */
        cnv->preFromUFirstCP=U_SENTINEL;

        /* write result */
        ucnv_extWriteFromU(cnv, cnv->sharedData->mbcs.extIndexes,
                           value,
                           &pArgs->target, pArgs->targetLimit,
                           &pArgs->offsets, srcIndex,
                           pErrorCode);
    } else if(match<0) {
        /* save state for partial match */
        const UChar *s;
        int32_t j;

        /* just _append_ the newly consumed input to preFromU[] */
        s=pArgs->source;
        match=-match-2; /* remove 2 for the initial code point */
        for(j=cnv->preFromULength; j<match; ++j) {
            U_ASSERT(j>=0);
            cnv->preFromU[j]=*s++;
        }
        pArgs->source=s; /* same as *src=srcLimit; because we reached the end of input */
        cnv->preFromULength=(int8_t)match;
    } else /* match==0 or 1 */ {
        /*
         * no match
         *
         * We need to split the previous input into two parts:
         *
         * 1. The first code point is unmappable - that's how we got into
         *    trying the extension data in the first place.
         *    We need to move it from the preFromU buffer
         *    to the error buffer, set an error code,
         *    and prepare the rest of the previous input for 2.
         *
         * 2. The rest of the previous input must be converted once we
         *    come back from the callback for the first code point.
         *    At that time, we have to try again from scratch to convert
         *    these input characters.
         *    The replay will be handled by the ucnv.c conversion code.
         */

        if(match==1) {
            /* matched, no mapping but request for <subchar1> */
            cnv->useSubChar1=TRUE;
        }

        /* move the first code point to the error field */
        cnv->fromUChar32=cnv->preFromUFirstCP;
        cnv->preFromUFirstCP=U_SENTINEL;

        /* mark preFromU for replay */
        cnv->preFromULength=-cnv->preFromULength;

        /* set the error code for unassigned */
        *pErrorCode=U_INVALID_CHAR_FOUND;
    }
}